

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

tmbstr stringWithFormat(ctmbstr fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  int local_34;
  char *pcStack_30;
  int len;
  tmbstr result;
  va_list argList;
  ctmbstr fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pcStack_30 = (char *)0x0;
  local_34 = 0;
  argList[0].overflow_arg_area = local_e8;
  argList[0]._0_8_ = &stack0x00000008;
  result._4_4_ = 0x30;
  result._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  argList[0].reg_save_area = fmt;
  local_34 = vsnprintf((char *)0x0,0,fmt,&result);
  pcStack_30 = (char *)malloc((long)(local_34 + 1));
  if (pcStack_30 == (char *)0x0) {
    outOfMemory();
  }
  argList[0].overflow_arg_area = local_e8;
  argList[0]._0_8_ = &stack0x00000008;
  result._4_4_ = 0x30;
  result._0_4_ = 8;
  vsnprintf(pcStack_30,(long)(local_34 + 1),(char *)argList[0].reg_save_area,&result);
  return pcStack_30;
}

Assistant:

static tmbstr stringWithFormat(const ctmbstr fmt, /**< The format string. */
                               ...                /**< Variable arguments. */
                               )
{
    va_list argList;
    tmbstr result = NULL;
    int len = 0;

    va_start(argList, fmt);
    len = vsnprintf( result, 0, fmt, argList );
    va_end(argList);

    if (!(result = malloc( len + 1) ))
        outOfMemory();

    va_start(argList, fmt);
    vsnprintf( result, len + 1, fmt, argList);
    va_end(argList);

    return result;
}